

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O2

int bindkey(KEYMAP **mapp,char *fname,KCHAR *keys,int kcount)

{
  short sVar1;
  int iVar2;
  PF p_Var3;
  long lVar4;
  KEYMAP *local_48;
  PF local_40;
  KEYMAP *local_38;
  KEYMAP *curmap;
  
  local_38 = *mapp;
  if (fname == (char *)0x0) {
    local_40 = rescan;
  }
  else {
    local_40 = name_function(fname);
    if (local_40 == (PF)0x0) {
      local_48 = name_map(fname);
      if (local_48 == (KEYMAP *)0x0) {
        dobeep();
        ewprintf("[No match: %s]",fname);
        return 0;
      }
      local_40 = (PF)0x0;
      goto LAB_0010d2b5;
    }
  }
  local_48 = (KEYMAP *)0x0;
LAB_0010d2b5:
  lVar4 = 0;
  do {
    if ((int)keys + -1 == (int)lVar4) {
      sVar1 = key.k_chars[lVar4];
      doscan(local_38,(int)sVar1,(KEYMAP **)0x0);
      iVar2 = remap(local_38,(int)sVar1,local_40,local_48);
      return iVar2;
    }
    sVar1 = key.k_chars[lVar4];
    p_Var3 = doscan(local_38,(int)sVar1,&local_38);
    if (p_Var3 != (PF)0x0) {
      iVar2 = remap(local_38,(int)sVar1,(PF)0x0,(KEYMAP *)0x0);
      if (iVar2 != 1) {
        return 0;
      }
      local_38 = ele->k_prefmap;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static int
bindkey(KEYMAP **mapp, const char *fname, KCHAR *keys, int kcount)
{
	KEYMAP	*curmap = *mapp;
	KEYMAP	*pref_map = NULL;
	PF	 funct;
	int	 c;

	if (fname == NULL)
		funct = rescan;
	else if (((funct = name_function(fname)) == NULL) ?
	    (pref_map = name_map(fname)) == NULL : funct == NULL) {
		dobeep();
		ewprintf("[No match: %s]", fname);
		return (FALSE);
	}
	while (--kcount) {
		if (doscan(curmap, c = *keys++, &curmap) != NULL) {
			if (remap(curmap, c, NULL, NULL) != TRUE)
				return (FALSE);
			/*
			 * XXX - Bizzarreness. remap creates an empty KEYMAP
			 *       that the last key is supposed to point to.
			 */
			curmap = ele->k_prefmap;
		}
	}
	(void)doscan(curmap, c = *keys, NULL);
	return (remap(curmap, c, funct, pref_map));
}